

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishset(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  uint uVar1;
  int iVar2;
  Table *t_00;
  bool bVar3;
  undefined4 uVar4;
  Table *local_58;
  Table *local_50;
  Table *h;
  TValue *tm;
  TValue *pTStack_30;
  int loop;
  TValue *slot_local;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._4_4_ = 0;
  pTStack_30 = slot;
  key_local = t;
  do {
    if (1999 < tm._4_4_) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
    if (pTStack_30 == (TValue *)0x0) {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_NEWINDEX);
      if (*(int *)&h->tt == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    else {
      t_00 = (Table *)(key_local->value_).gc;
      if (t_00->metatable == (Table *)0x0) {
        local_50 = (Table *)0x0;
      }
      else {
        if ((t_00->metatable->flags & 2) == 0) {
          local_58 = (Table *)luaT_gettm(t_00->metatable,TM_NEWINDEX,L->l_G->tmname[1]);
        }
        else {
          local_58 = (Table *)0x0;
        }
        local_50 = local_58;
      }
      h = local_50;
      if (local_50 == (Table *)0x0) {
        if (pTStack_30 == &luaO_nilobject_) {
          pTStack_30 = luaH_newkey(L,t_00,key);
        }
        pTStack_30->value_ = val->value_;
        uVar4 = *(undefined4 *)&val->field_0xc;
        pTStack_30->tt_ = val->tt_;
        *(undefined4 *)&pTStack_30->field_0xc = uVar4;
        t_00->flags = '\0';
        if ((val->tt_ & 0x40U) == 0) {
          return;
        }
        if ((t_00->marked & 4) == 0) {
          return;
        }
        if ((((val->value_).gc)->marked & 3) == 0) {
          return;
        }
        luaC_barrierback_(L,t_00);
        return;
      }
    }
    uVar1._0_1_ = h->tt;
    uVar1._1_1_ = h->marked;
    uVar1._2_1_ = h->flags;
    uVar1._3_1_ = h->lsizenode;
    if ((uVar1 & 0xf) == 6) {
      luaT_callTM(L,(TValue *)h,key_local,key,val,0);
      return;
    }
    key_local = (TValue *)h;
    iVar2._0_1_ = h->tt;
    iVar2._1_1_ = h->marked;
    iVar2._2_1_ = h->flags;
    iVar2._3_1_ = h->lsizenode;
    if (iVar2 == 0x45) {
      pTStack_30 = luaH_get((Table *)h->next,key);
      if (pTStack_30->tt_ == 0) {
        bVar3 = false;
      }
      else {
        if ((((val->tt_ & 0x40U) != 0) && ((h->next->marked & 4) != 0)) &&
           ((((val->value_).gc)->marked & 3) != 0)) {
          luaC_barrierback_(L,(Table *)h->next);
        }
        pTStack_30->value_ = val->value_;
        uVar4 = *(undefined4 *)&val->field_0xc;
        pTStack_30->tt_ = val->tt_;
        *(undefined4 *)&pTStack_30->field_0xc = uVar4;
        bVar3 = true;
      }
      if (bVar3) {
        return;
      }
    }
    else {
      pTStack_30 = (TValue *)0x0;
    }
    tm._4_4_ = tm._4_4_ + 1;
  } while( true );
}

Assistant:

void luaV_finishset(lua_State *L, const TValue *t, TValue *key,
                    StkId val, const TValue *slot) {
    int loop;  /* counter to avoid infinite loops */
    for (loop = 0; loop < MAXTAGLOOP; loop++) {
        const TValue *tm;  /* '__newindex' metamethod */
        if (slot != NULL) {  /* is 't' a table? */
            Table *h = hvalue(t);  /* save 't' table */
            lua_assert(ttisnil(slot));  /* old value must be nil */
            tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
            if (tm == NULL) {  /* no metamethod? */
                if (slot == luaO_nilobject)  /* no previous entry? */
                    slot = luaH_newkey(L, h, key);  /* create one */
                /* no metamethod and (now) there is an entry with given key */
                setobj2t(L, cast(TValue * , slot), val);  /* set its new value */
                invalidateTMcache(h);
                luaC_barrierback(L, h, val);
                return;
            }
            /* else will try the metamethod */
        } else {  /* not a table; check metamethod */
            if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
                luaG_typeerror(L, t, "index");
        }
        /* try the metamethod */
        if (ttisfunction(tm)) {
            luaT_callTM(L, tm, t, key, val, 0);
            return;
        }
        t = tm;  /* else repeat assignment over 'tm' */
        if (luaV_fastset(L, t, key, slot, luaH_get, val))
            return;  /* done */
        /* else loop */
    }
    luaG_runerror(L, "'__newindex' chain too long; possible loop");
}